

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalVector.hpp
# Opt level: O2

void __thiscall
limonp::LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_>::reserve
          (LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_> *this,size_t size)

{
  ulong uVar1;
  LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_> *__src;
  pair<unsigned_long,_const_cppjieba::DictUnit_*> *__dest;
  
  uVar1 = this->capacity_;
  if (uVar1 < size) {
    __dest = (pair<unsigned_long,_const_cppjieba::DictUnit_*> *)malloc(size << 4);
    if (__dest == (pair<unsigned_long,_const_cppjieba::DictUnit_*> *)0x0) {
      __assert_fail("next",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cppjieba-cabi/cppjieba/deps/limonp/LocalVector.hpp"
                    ,0x5c,
                    "void limonp::LocalVector<std::pair<unsigned long, const cppjieba::DictUnit *>>::reserve(size_t) [T = std::pair<unsigned long, const cppjieba::DictUnit *>]"
                   );
    }
    __src = (LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_> *)this->ptr_;
    this->ptr_ = __dest;
    memcpy(__dest,__src,uVar1 << 4);
    this->capacity_ = size;
    if (__src != this) {
      free(__src);
      return;
    }
  }
  return;
}

Assistant:

void reserve(size_t size) {
    if(size <= capacity_) {
      return;
    }
    T * next =  (T*)malloc(sizeof(T) * size);
    assert(next);
    T * old = ptr_;
    ptr_ = next;
    memcpy(ptr_, old, sizeof(T) * capacity_);
    capacity_ = size;
    if(old != buffer_) {
      free(old);
    }
  }